

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O2

void Bac_ManWriteBlifArray2(FILE *pFile,Bac_Ntk_t *p,int iObj)

{
  int iVar1;
  Bac_Ntk_t *p_00;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  
  p_00 = Bac_BoxNtk(p,iObj);
  iVar5 = iObj + -1;
  iVar4 = 0;
  while( true ) {
    if ((p_00->vInputs).nSize <= iVar4) {
      iVar5 = iObj + 1;
      iVar4 = 0;
      while( true ) {
        if ((p_00->vOutputs).nSize <= iVar4) {
          fputc(10,(FILE *)pFile);
          return;
        }
        iVar1 = Vec_IntEntry(&p_00->vOutputs,iVar4);
        pcVar2 = Bac_ObjNameStr(p_00,iVar1);
        iVar1 = Bac_ObjIsBox(p,iObj);
        if (iVar1 == 0) break;
        pcVar3 = Bac_ObjNameStr(p,iVar5);
        fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
        iVar4 = iVar4 + 1;
        iVar5 = iVar5 + 1;
      }
      __assert_fail("Bac_ObjIsBox(p, b)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
    }
    iVar1 = Vec_IntEntry(&p_00->vInputs,iVar4);
    pcVar2 = Bac_ObjNameStr(p_00,iVar1);
    iVar1 = Bac_ObjIsBox(p,iObj);
    if (iVar1 == 0) break;
    pcVar3 = Bac_ObjNameStr(p,iVar5);
    fprintf((FILE *)pFile," %s=%s",pcVar2,pcVar3);
    iVar4 = iVar4 + 1;
    iVar5 = iVar5 + -1;
  }
  __assert_fail("Bac_ObjIsBox(p, b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
}

Assistant:

void Bac_ManWriteBlifArray2( FILE * pFile, Bac_Ntk_t * p, int iObj )
{
    int iTerm, i;
    Bac_Ntk_t * pModel = Bac_BoxNtk( p, iObj );
    Bac_NtkForEachPi( pModel, iTerm, i )
        fprintf( pFile, " %s=%s", Bac_ObjNameStr(pModel, iTerm), Bac_ObjNameStr(p, Bac_BoxBi(p, iObj, i)) );
    Bac_NtkForEachPo( pModel, iTerm, i )
        fprintf( pFile, " %s=%s", Bac_ObjNameStr(pModel, iTerm), Bac_ObjNameStr(p, Bac_BoxBo(p, iObj, i)) );
    fprintf( pFile, "\n" );
}